

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_dispatch.cpp
# Opt level: O2

void __thiscall FExecList::AddPullins(FExecList *this,TArray<FString,_FString> *wads)

{
  uint i;
  ulong uVar1;
  
  for (uVar1 = 0; uVar1 < (this->Pullins).Count; uVar1 = uVar1 + 1) {
    D_AddFile(wads,(this->Pullins).Array[uVar1].Chars,true,-1);
  }
  return;
}

Assistant:

void FExecList::AddPullins(TArray<FString> &wads) const
{
	for (unsigned i = 0; i < Pullins.Size(); ++i)
	{
		D_AddFile(wads, Pullins[i]);
	}
}